

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O0

QString * systemThemeName(void)

{
  bool bVar1;
  QPlatformTheme *pQVar2;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QPlatformTheme *theme;
  QString *override;
  QVariant themeHint;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&(in_RDI->d).data + 8) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&(in_RDI->d).data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  qEnvironmentVariable((char *)in_RDI);
  bVar1 = QString::isEmpty((QString *)0x29d27f);
  if (bVar1) {
    QString::~QString((QString *)0x29d2ab);
    pQVar2 = QGuiApplicationPrivate::platformTheme();
    if (pQVar2 != (QPlatformTheme *)0x0) {
      local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      (*pQVar2->_vptr_QPlatformTheme[0xc])(&local_28,pQVar2,0xe);
      bVar1 = QVariant::isValid(in_RDI);
      if (bVar1) {
        QVariant::toString();
      }
      QVariant::~QVariant((QVariant *)&local_28);
      if (bVar1) goto LAB_0029d368;
    }
    QString::QString((QString *)0x29d368);
  }
LAB_0029d368:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static inline QString systemThemeName()
{
    if (QString override = qEnvironmentVariable("QT_QPA_SYSTEM_ICON_THEME"); !override.isEmpty())
        return override;
    if (const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme()) {
        const QVariant themeHint = theme->themeHint(QPlatformTheme::SystemIconThemeName);
        if (themeHint.isValid())
            return themeHint.toString();
    }
    return QString();
}